

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.h
# Opt level: O0

SSTableData * __thiscall
DiskTable::
merge<std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*>
          (SSTableData *__return_storage_ptr__,DiskTable *this,
          vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *datas,
          vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *datas_1,
          vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *datas_2)

{
  anon_class_16_1_1a1a2d91 __f;
  initializer_list<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>
  __l;
  bool bVar1;
  reference ppVar2;
  iterator __first;
  iterator __last;
  reference __x;
  __normal_iterator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_*,_std::vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>_>
  local_f8;
  __normal_iterator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_*,_std::vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>_>
  local_f0;
  iterator seq2;
  undefined1 auStack_e0 [8];
  pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>
  merge_resolution;
  allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>
  local_b9;
  __normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
  local_b8;
  __normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
  local_b0;
  __normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
  local_a8;
  __normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
  local_a0;
  __normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
  local_98;
  __normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
  local_90;
  pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>
  local_88;
  pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>
  local_78;
  pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>
  local_68;
  pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>
  *local_58;
  size_type local_50;
  undefined1 local_48 [8];
  vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
  merge_seqs;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *datas_local_2;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *datas_local_1;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *datas_local;
  DiskTable *this_local;
  SSTableData *merge_result;
  
  merge_seqs.
  super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)datas_2;
  local_90._M_current =
       (SSTableDataEntry *)
       std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::begin(datas);
  local_98._M_current =
       (SSTableDataEntry *)
       std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::end(datas);
  std::
  pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>
  ::
  pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,_true>
            (&local_88,&local_90,&local_98);
  local_a0._M_current =
       (SSTableDataEntry *)
       std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::begin(datas_1);
  local_a8._M_current =
       (SSTableDataEntry *)
       std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::end(datas_1);
  std::
  pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>
  ::
  pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,_true>
            (&local_78,&local_a0,&local_a8);
  local_b0._M_current =
       (SSTableDataEntry *)
       std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::begin
                 ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)
                  merge_seqs.
                  super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_b8._M_current =
       (SSTableDataEntry *)
       std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::end
                 ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)
                  merge_seqs.
                  super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>
  ::
  pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,_true>
            (&local_68,&local_b0,&local_b8);
  local_50 = 3;
  local_58 = &local_88;
  std::
  allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>
  ::allocator(&local_b9);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::
  vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
  ::vector((vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
            *)local_48,__l,&local_b9);
  std::
  allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>
  ::~allocator(&local_b9);
  merge_resolution.second._M_current._3_1_ = 0;
  memset(__return_storage_ptr__,0,0x18);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector(__return_storage_ptr__);
  while( true ) {
    seq2 = std::
           vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
           ::begin((vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
                    *)local_48);
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_*,_std::vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>_>
             ::operator*(&seq2);
    auStack_e0 = (undefined1  [8])(ppVar2->first)._M_current;
    merge_resolution.first._M_current = (ppVar2->second)._M_current;
    local_f0._M_current =
         (pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>
          *)std::
            vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
            ::begin((vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
                     *)local_48);
    while( true ) {
      local_f8._M_current =
           (pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>
            *)std::
              vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
              ::end((vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
                     *)local_48);
      bVar1 = __gnu_cxx::operator!=(&local_f0,&local_f8);
      if (!bVar1) break;
      ppVar2 = __gnu_cxx::
               __normal_iterator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_*,_std::vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>_>
               ::operator*(&local_f0);
      bVar1 = merge<std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_*>
              ::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)
                         &merge<std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*>(std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*)
                          ::compare_merge_seqs_prefer_current,ppVar2,(MergeSeq *)auStack_e0);
      if (bVar1) {
        ppVar2 = __gnu_cxx::
                 __normal_iterator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_*,_std::vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>_>
                 ::operator*(&local_f0);
        std::
        pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>
        ::operator=((pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>
                     *)auStack_e0,ppVar2);
      }
      __gnu_cxx::
      __normal_iterator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_*,_std::vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>_>
      ::operator++(&local_f0,0);
    }
    __first = std::
              vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
              ::begin((vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
                       *)local_48);
    __last = std::
             vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
             ::end((vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
                    *)local_48);
    __f.merge_resolution.second._M_current = merge_resolution.first._M_current;
    __f.merge_resolution.first._M_current = (SSTableDataEntry *)auStack_e0;
    std::
    for_each<__gnu_cxx::__normal_iterator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>>,__gnu_cxx::__normal_iterator<SSTableDataEntry*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>>>*,std::vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>>,__gnu_cxx::__normal_iterator<SSTableDataEntry*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>>>,std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>>,__gnu_cxx::__normal_iterator<SSTableDataEntry*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>>>>>>,DiskTable::merge<std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*>(std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*)::_lambda(std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>>,__gnu_cxx::__normal_iterator<SSTableDataEntry*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>>>&)_1_>
              ((__normal_iterator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_*,_std::vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_*,_std::vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>_>
                )__last._M_current,__f);
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
                        *)auStack_e0,&merge_resolution.first);
    if (bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
          ::operator*((__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
                       *)auStack_e0);
    std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::push_back
              (__return_storage_ptr__,__x);
  }
  merge_resolution.second._M_current._3_1_ = 1;
  std::
  vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
  ::~vector((vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
             *)local_48);
  return __return_storage_ptr__;
}

Assistant:

SSTableData DiskTable::merge(Datas... datas) {
    /* A MergeSeq is a pair abstracting a Sequence of SSTableDataEntry objects to be merged together.
     * It's made up of two iterator, from same SSTableData object, first one indicating current position of the sequence,
     * second one indicating the end of the sequence, so when first==second, the sequence has been consumed fully.
     */
    auto merge_seqs = std::vector<MergeSeq>{{datas->begin(), datas->end()}...};
    auto merge_result = SSTableData{};
    static auto compare_merge_seqs_prefer_current = [](const MergeSeq &candidate, const MergeSeq &current) {
        /*
         * Determining whether candidate or current has been fully consumed or not.
         * if candidate has ran out of and current not, take current, or vice versa.
         * if both candidate and current are fully consumed, continue to find another sequence.
         * When all sequences of merge_seqs have been fully consumed, min_element would
         * return a ended sequence eventually, and merge process terminates at that time.
         */
        if (candidate.first == candidate.second && current.first != current.second) {
            return false;
        }
        if (candidate.first != candidate.second && current.first == current.second) {
            return true;
        }
        if (candidate.first == candidate.second && current.first == current.second) {
            return false;
        }
        /*
         * If candidate and current have not been fully consumed, compare key of their
         * current entry, take smaller one, if their key equals, compare timestamp,
         * and take larger one.
         * If timestamp equals, takes current, because first in data takes precedence in merge function.
         */
        if (candidate.first->key < current.first->key) {
            return true;
        } else if (candidate.first->key == current.first->key) {
            return candidate.first->timestamp >
                   current.first->timestamp;
        } else {
            return false;
        }
    };
    while (true) {
        auto merge_resolution = *merge_seqs.begin();
        for (auto seq2 = merge_seqs.begin(); seq2 != merge_seqs.end(); seq2++) {
            if (compare_merge_seqs_prefer_current(*seq2, merge_resolution)) {
                merge_resolution = *seq2;
            }
        }
        std::for_each(merge_seqs.begin(), merge_seqs.end(), [merge_resolution](MergeSeq &seq) {
            if (seq.first->key == merge_resolution.first->key && seq.first != seq.second) {
                ++seq.first;
            }
        });
        if (merge_resolution.first == merge_resolution.second) {
            break;
        }
        merge_result.push_back(*merge_resolution.first);
    }
    return merge_result;
}